

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O1

ktx_uint32_t ktxTexture2_calcRequiredLevelAlignment(ktxTexture2 *This)

{
  uint uVar1;
  ktx_uint32_t a;
  uint32_t uVar2;
  
  a = 1;
  if ((This->supercompressionScheme == KTX_SS_BEGIN_RANGE) &&
     (uVar1 = (This->_protected->_formatSize).blockSizeInBits, a = uVar1 >> 3, (uVar1 & 0x18) != 0))
  {
    uVar2 = gcd(a,4);
    return (a * 4) / uVar2;
  }
  return a;
}

Assistant:

ktx_uint32_t
 ktxTexture2_calcRequiredLevelAlignment(ktxTexture2* This)
 {
    ktx_uint32_t alignment;
    if (This->supercompressionScheme != KTX_SS_NONE)
        alignment = 1;
    else
        alignment = lcm4(This->_protected->_formatSize.blockSizeInBits / 8);
    return alignment;
 }